

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clustergraph.h
# Opt level: O2

bool __thiscall libDAI::ClusterGraph::isMaximal(ClusterGraph *this,size_t I)

{
  pointer pVVar1;
  bool bVar2;
  pointer pvVar3;
  unsigned_long uVar4;
  bool bVar5;
  size_t *psVar6;
  pointer puVar7;
  
  pvVar3 = (this->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._nb2.
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar1 = (this->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V2.
           super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar5 = true;
  puVar7 = pvVar3[I].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  while ((puVar7 != *(pointer *)
                     ((long)&pvVar3[I].
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data + 8) && (bVar5))) {
    uVar4 = *puVar7;
    pvVar3 = (this->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._nb1.
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar6 = pvVar3[uVar4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_start;
    while ((psVar6 != *(pointer *)
                       ((long)&pvVar3[uVar4].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data + 8) && (bVar5 != false))) {
      if (*psVar6 != I) {
        bVar2 = VarSet::includes((this->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V2.
                                 super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>
                                 ._M_impl.super__Vector_impl_data._M_start + *psVar6,pVVar1 + I);
        uVar4 = *puVar7;
        if (bVar2) {
          bVar5 = false;
        }
        pvVar3 = (this->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._nb1.
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      psVar6 = psVar6 + 1;
    }
    pvVar3 = (this->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._nb2.
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar7 = puVar7 + 1;
  }
  return bVar5;
}

Assistant:

bool isMaximal( size_t I ) const {
                assert( I < nr2() );
                const VarSet & clI = V2(I);
                bool maximal = true;
                // The following may not be optimal, since it may repeatedly test the same cluster *J
                for( nb_cit i = nb2(I).begin(); i != nb2(I).end() && maximal; i++ )
                    for( nb_cit J = nb1(*i).begin(); J != nb1(*i).end() && maximal; J++ ) 
                        if( (*J != I) && (clI << V2(*J)) )
                            maximal = false;
                return maximal;
            }